

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void __thiscall
glslang::TReflectionTraverser::blowUpActiveAggregate
          (TReflectionTraverser *this,TType *baseType,TString *baseName,
          TList<glslang::TIntermBinary_*> *derefs,const_iterator deref,int offset,int blockIndex,
          int arraySize,int topLevelArraySize,int topLevelArrayStride,TStorageQualifier baseStorage,
          bool active)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  *paVar1;
  EShLanguageMask *pEVar2;
  EShReflectionOptions EVar3;
  pointer pcVar4;
  _List_node_base *p_Var5;
  TReflection *pTVar6;
  pointer pTVar7;
  iterator __position;
  bool bVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined4 extraout_var;
  _List_node_header *deref_00;
  long *plVar14;
  TType *pTVar15;
  iterator iVar16;
  long lVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  mapped_type *pmVar18;
  size_t sVar19;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar20;
  void *__child_stack;
  uint uVar21;
  ulong uVar22;
  vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *this_00;
  int i;
  long lVar23;
  TType *this_01;
  allocator_type __fn;
  const_iterator deref_01;
  long lVar24;
  bool bVar25;
  TStorageQualifier TVar26;
  TType *local_280;
  int local_258;
  TString newBaseName_2;
  TVector<int> memberOffsets;
  TString name;
  TString newBaseName;
  TArraySizes *local_140;
  char text_1 [16];
  size_type local_f8;
  undefined1 local_f0 [24];
  char text [16];
  TString newBaseName_1;
  
  EVar3 = this->reflection->options;
  deref_01._M_node = deref._M_node;
  iVar10 = (*baseType->_vptr_TType[7])(baseType);
  if (iVar10 == 0x10) {
    iVar10 = (*baseType->_vptr_TType[0xb])(baseType);
    bVar25 = (*(uint *)(CONCAT44(extraout_var,iVar10) + 8) & 0x7f) == 6;
  }
  else {
    bVar25 = false;
  }
  name._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
  pcVar4 = (baseName->_M_dataplus)._M_p;
  name._M_dataplus._M_p = (pointer)&name.field_2;
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                      &name,pcVar4,pcVar4 + baseName->_M_string_length);
  deref_00 = &(derefs->
              super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
              ).
              super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
              ._M_impl._M_node;
  local_280 = baseType;
  if (deref_00 != (_List_node_header *)deref._M_node) {
    do {
      p_Var5 = deref._M_node[1]._M_next;
      local_280 = (TType *)(*(code *)p_Var5->_M_next[0xf]._M_next)(p_Var5);
      iVar10 = *(int *)&p_Var5[0xb]._M_prev;
      bVar8 = true;
      if (iVar10 == 0x33) {
        plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
        pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
        iVar10 = getArrayStride(this,baseType,pTVar15);
        plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_prev)(p_Var5);
        lVar23 = (**(code **)(*plVar14 + 0x28))(plVar14);
        uVar21 = **(uint **)(*(long *)(lVar23 + 0xc0) + 8);
        iVar11 = (*local_280->_vptr_TType[7])();
        if (iVar11 != 0x10) {
          if ((EVar3 & EShReflectionStrictArraySuffix) == EShReflectionDefault) {
            iVar11 = (*baseType->_vptr_TType[7])(baseType);
            if (iVar11 != 0x10) goto LAB_00377757;
          }
          else if (bVar25 == false) {
LAB_00377757:
            newBaseName_2._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            newBaseName_2._M_dataplus._M_p = (pointer)&newBaseName_2.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &newBaseName_2,"[","");
            snprintf(text_1,0x10,"%d",(ulong)uVar21);
            memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
            super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.
            allocator = GetThreadPoolAllocator();
            memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
            super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)&memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                                 super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
            sVar19 = strlen(text_1);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &memberOffsets,text_1,text_1 + sVar19);
            pbVar20 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      _M_append(&newBaseName_2,
                                (char *)memberOffsets.
                                        super_vector<int,_glslang::pool_allocator<int>_>.
                                        super__Vector_base<int,_glslang::pool_allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start,
                                (size_type)
                                memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                                super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish);
            newBaseName_1._M_dataplus.super_allocator_type.allocator =
                 (pbVar20->_M_dataplus).super_allocator_type.allocator;
            newBaseName_1._M_dataplus._M_p = (pointer)&newBaseName_1.field_2;
            pcVar4 = (pbVar20->_M_dataplus)._M_p;
            paVar1 = &pbVar20->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                 *)pcVar4 == paVar1) {
              newBaseName_1.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              newBaseName_1.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
            }
            else {
              newBaseName_1.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              newBaseName_1._M_dataplus._M_p = pcVar4;
            }
            newBaseName_1._M_string_length = pbVar20->_M_string_length;
            (pbVar20->_M_dataplus)._M_p = (pointer)paVar1;
            pbVar20->_M_string_length = 0;
            (pbVar20->field_2)._M_local_buf[0] = '\0';
            pbVar20 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      append(&newBaseName_1,"]");
            newBaseName._M_dataplus.super_allocator_type.allocator =
                 (pbVar20->_M_dataplus).super_allocator_type.allocator;
            newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
            pcVar4 = (pbVar20->_M_dataplus)._M_p;
            paVar1 = &pbVar20->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                 *)pcVar4 == paVar1) {
              newBaseName.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              newBaseName.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
            }
            else {
              newBaseName.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
              newBaseName._M_dataplus._M_p = pcVar4;
            }
            newBaseName._M_string_length = pbVar20->_M_string_length;
            (pbVar20->_M_dataplus)._M_p = (pointer)paVar1;
            pbVar20->_M_string_length = 0;
            (pbVar20->field_2)._M_local_buf[0] = '\0';
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::_M_append(&name,newBaseName._M_dataplus._M_p,newBaseName._M_string_length);
            if (-1 < offset) {
              offset = offset + uVar21 * iVar10;
            }
          }
          else {
            newBaseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
            newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char_const*>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       &newBaseName,"[0]","");
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::_M_append(&name,newBaseName._M_dataplus._M_p,newBaseName._M_string_length);
          }
        }
        if (topLevelArrayStride != 0) {
          iVar10 = topLevelArrayStride;
        }
        topLevelArrayStride = iVar10;
        if (topLevelArrayStride != 0) {
          plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
          pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
LAB_00377930:
          iVar10 = (*pTVar15->_vptr_TType[0x1d])();
          if ((char)iVar10 != '\0') {
            bVar25 = false;
          }
        }
      }
      else if (iVar10 == 0x35) {
        plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_prev)(p_Var5);
        lVar23 = (**(code **)(*plVar14 + 0x28))(plVar14);
        iVar10 = **(int **)(*(long *)(lVar23 + 0xc0) + 8);
        if (-1 < offset) {
          plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
          pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
          iVar11 = TIntermediate::getOffset(pTVar15,iVar10);
          offset = offset + iVar11;
        }
        if (name._M_string_length != 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          append(&name,".");
        }
        plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
        plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
        cVar9 = (**(code **)(*plVar14 + 0x128))(plVar14);
        if (cVar9 == '\0') goto LAB_00378490;
        lVar23 = (**(code **)(**(long **)(*(long *)(plVar14[0xd] + 8) + (long)iVar10 * 0x20) + 0x30)
                 )();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_append(&name,*(char **)(lVar23 + 8),*(size_type *)(lVar23 + 0x10));
        plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
        plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
        iVar10 = (**(code **)(*plVar14 + 0x38))(plVar14);
        pTVar15 = local_280;
        if (iVar10 != 0x10) goto LAB_00377930;
      }
      else if (iVar10 == 0x34) {
        plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
        pTVar15 = (TType *)(**(code **)(*plVar14 + 0xf0))(plVar14);
        iVar10 = getArrayStride(this,baseType,pTVar15);
        if (topLevelArrayStride == 0) {
          topLevelArrayStride = iVar10;
        }
        plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_next)(p_Var5);
        plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
        (**(code **)(*plVar14 + 0x78))(plVar14);
        uVar22 = 0;
        do {
          newBaseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&newBaseName,name._M_dataplus._M_p,
                              name._M_dataplus._M_p + name._M_string_length);
          iVar11 = (*local_280->_vptr_TType[7])(local_280);
          if (iVar11 != 0x10) {
            if ((EVar3 & EShReflectionStrictArraySuffix) == EShReflectionDefault) {
              iVar11 = (*baseType->_vptr_TType[7])();
              if (iVar11 != 0x10) goto LAB_0037734a;
            }
            else {
              if (bVar25) {
                newBaseName_1._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
                newBaseName_1._M_dataplus._M_p = (pointer)&newBaseName_1.field_2;
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                _M_construct<char_const*>
                          ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                            *)&newBaseName_1,"[0]","");
              }
              else {
LAB_0037734a:
                memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.
                allocator = GetThreadPoolAllocator();
                memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start =
                     (pointer)&memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                               super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                _M_construct<char_const*>
                          ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                            *)&memberOffsets,"[","");
                snprintf(text,0x10,"%d",uVar22);
                text_1._0_8_ = GetThreadPoolAllocator();
                text_1._8_8_ = local_f0;
                sVar19 = strlen(text);
                std::__cxx11::
                basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
                _M_construct<char_const*>
                          ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                            *)text_1,text,text + sVar19);
                pbVar20 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::_M_append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)&memberOffsets,(char *)text_1._8_8_,local_f8);
                newBaseName_2._M_dataplus.super_allocator_type.allocator =
                     (pbVar20->_M_dataplus).super_allocator_type.allocator;
                newBaseName_2._M_dataplus._M_p = (pointer)&newBaseName_2.field_2;
                pcVar4 = (pbVar20->_M_dataplus)._M_p;
                paVar1 = &pbVar20->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                     *)pcVar4 == paVar1) {
                  newBaseName_2.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                  newBaseName_2.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
                }
                else {
                  newBaseName_2.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                  newBaseName_2._M_dataplus._M_p = pcVar4;
                }
                newBaseName_2._M_string_length = pbVar20->_M_string_length;
                (pbVar20->_M_dataplus)._M_p = (pointer)paVar1;
                pbVar20->_M_string_length = 0;
                (pbVar20->field_2)._M_local_buf[0] = '\0';
                pbVar20 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                          ::append(&newBaseName_2,"]");
                newBaseName_1._M_dataplus.super_allocator_type.allocator =
                     (pbVar20->_M_dataplus).super_allocator_type.allocator;
                newBaseName_1._M_dataplus._M_p = (pbVar20->_M_dataplus)._M_p;
                paVar1 = &pbVar20->field_2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
                     *)newBaseName_1._M_dataplus._M_p == paVar1) {
                  newBaseName_1.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                  newBaseName_1.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
                  newBaseName_1._M_dataplus._M_p = (pointer)&newBaseName_1.field_2;
                }
                else {
                  newBaseName_1.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
                }
                newBaseName_1._M_string_length = pbVar20->_M_string_length;
                (pbVar20->_M_dataplus)._M_p = (pointer)paVar1;
                pbVar20->_M_string_length = 0;
                (pbVar20->field_2)._M_local_buf[0] = '\0';
              }
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::_M_append
                        (&newBaseName,newBaseName_1._M_dataplus._M_p,newBaseName_1._M_string_length)
              ;
            }
          }
          deref_01._M_node = (deref._M_node)->_M_next;
          blowUpActiveAggregate
                    (this,local_280,&newBaseName,derefs,deref_01,offset,blockIndex,arraySize,
                     topLevelArraySize,topLevelArrayStride,baseStorage,active);
          bVar8 = false;
          iVar11 = iVar10;
          if (offset < 0) {
            iVar11 = 0;
          }
          offset = iVar11 + offset;
          uVar21 = (int)uVar22 + 1;
          uVar22 = (ulong)uVar21;
          plVar14 = (long *)(*(code *)p_Var5->_M_next[0x19]._M_next)();
          plVar14 = (long *)(**(code **)(*plVar14 + 0xf0))(plVar14);
          iVar11 = (**(code **)(*plVar14 + 0x78))(plVar14);
        } while ((int)uVar21 < iVar11);
      }
      if (!bVar8) {
        return;
      }
      deref._M_node = (deref._M_node)->_M_next;
    } while ((_List_node_header *)deref._M_node != deref_00);
  }
  bVar8 = isReflectionGranularity(this,local_280);
  if (bVar8) {
    if (((this->reflection->options & EShReflectionBasicArraySuffix) != EShReflectionDefault) &&
       (iVar10 = (*local_280->_vptr_TType[0x1d])(local_280), (char)iVar10 != '\0')) {
      newBaseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
      newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
      std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
      _M_construct<char_const*>
                ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                 &newBaseName,"[0]","");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      _M_append(&name,newBaseName._M_dataplus._M_p,newBaseName._M_string_length);
    }
    if (arraySize == 0) {
      iVar10 = (*local_280->_vptr_TType[0x1d])(local_280);
      arraySize = 1;
      if ((char)iVar10 != '\0') {
        arraySize = (*local_280->_vptr_TType[0xf])(local_280);
      }
    }
    pTVar6 = this->reflection;
    lVar23 = 0x128;
    if ((pTVar6->options & EShReflectionSeparateBuffers) == EShReflectionDefault) {
      lVar23 = 0xf8;
    }
    if (baseStorage != EvqBuffer) {
      lVar23 = 0xf8;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&newBaseName,name._M_dataplus._M_p,(allocator<char> *)&newBaseName_1);
    iVar16 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::find(&(pTVar6->nameToIndex)._M_t,(key_type *)&newBaseName);
    if (newBaseName._M_dataplus.super_allocator_type.allocator !=
        (TPoolAllocator *)&newBaseName._M_string_length) {
      operator_delete(newBaseName._M_dataplus.super_allocator_type.allocator,
                      newBaseName._M_string_length + 1);
    }
    this_00 = (vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_> *)
              ((long)&pTVar6->_vptr_TReflection + lVar23);
    pTVar6 = this->reflection;
    if ((_Rb_tree_header *)iVar16._M_node ==
        &(pTVar6->nameToIndex)._M_t._M_impl.super__Rb_tree_header) {
      iVar10 = (int)((ulong)((long)(this_00->
                                   super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this_00->
                                  super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333;
      newBaseName_2._M_dataplus.super_allocator_type.allocator._0_4_ = iVar10;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&newBaseName,name._M_dataplus._M_p,(allocator<char> *)&newBaseName_1);
      pmVar18 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::operator[](&pTVar6->nameToIndex,(key_type *)&newBaseName);
      *pmVar18 = iVar10;
      if (newBaseName._M_dataplus.super_allocator_type.allocator !=
          (TPoolAllocator *)&newBaseName._M_string_length) {
        operator_delete(newBaseName._M_dataplus.super_allocator_type.allocator,
                        newBaseName._M_string_length + 1);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&newBaseName_1,name._M_dataplus._M_p,(allocator<char> *)&memberOffsets);
      iVar10 = mapToGlType(this,local_280);
      newBaseName._M_dataplus.super_allocator_type.allocator =
           (TPoolAllocator *)&newBaseName._M_string_length;
      __fn = newBaseName_1._M_dataplus.super_allocator_type;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&newBaseName,newBaseName_1._M_dataplus.super_allocator_type.allocator,
                 newBaseName_1._M_dataplus._M_p +
                 (long)newBaseName_1._M_dataplus.super_allocator_type.allocator);
      newBaseName.field_2._12_4_ = iVar10;
      newBaseName.field_2._8_4_ = offset;
      TType::clone(local_280,(__fn *)__fn.allocator,__child_stack,baseStorage,deref_01._M_node);
      std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
      emplace_back<glslang::TObjectReflection>(this_00,(TObjectReflection *)&newBaseName);
      if (newBaseName._M_dataplus.super_allocator_type.allocator !=
          (TPoolAllocator *)&newBaseName._M_string_length) {
        operator_delete(newBaseName._M_dataplus.super_allocator_type.allocator,
                        newBaseName._M_string_length + 1);
      }
      if (newBaseName_1._M_dataplus.super_allocator_type.allocator !=
          (TPoolAllocator *)&newBaseName_1._M_string_length) {
        operator_delete(newBaseName_1._M_dataplus.super_allocator_type.allocator,
                        newBaseName_1._M_string_length + 1);
      }
      iVar10 = (*local_280->_vptr_TType[0x1d])(local_280);
      if ((char)iVar10 != '\0') {
        iVar10 = getArrayStride(this,baseType,local_280);
        (this_00->
        super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>)
        ._M_impl.super__Vector_impl_data._M_finish[-1].arrayStride = iVar10;
        if (topLevelArrayStride == 0) {
          topLevelArrayStride = iVar10;
        }
      }
      pTVar6 = this->reflection;
      if (((pTVar6->options & EShReflectionSeparateBuffers) != EShReflectionDefault) &&
         (local_280->field_0x8 == '\r')) {
        __position._M_current =
             (pTVar6->atomicCounterUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pTVar6->atomicCounterUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&pTVar6->atomicCounterUniformIndices,
                     __position,(int *)&newBaseName_2);
        }
        else {
          *__position._M_current = (int)newBaseName_2._M_dataplus.super_allocator_type.allocator;
          (pTVar6->atomicCounterUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      pTVar7 = (this_00->
               super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      pTVar7[-1].topLevelArraySize = topLevelArraySize;
      pTVar7[-1].topLevelArrayStride = topLevelArrayStride;
      if (active && (this->reflection->options & EShReflectionAllBlockVariables) !=
                    EShReflectionDefault) {
        pTVar7[-1].stages = pTVar7[-1].stages | 1 << ((char)this->intermediate->language & 0x1f);
      }
    }
    else {
      if (1 < arraySize) {
        pTVar7 = (this_00->
                 super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        iVar10 = pTVar7[(int)iVar16._M_node[2]._M_color].size;
        if (iVar10 < arraySize) {
          iVar10 = arraySize;
        }
        pTVar7[(int)iVar16._M_node[2]._M_color].size = iVar10;
      }
      if (active && (pTVar6->options & EShReflectionAllBlockVariables) != EShReflectionDefault) {
        pEVar2 = &(this_00->
                  super__Vector_base<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                  )._M_impl.super__Vector_impl_data._M_start[(int)iVar16._M_node[2]._M_color].stages
        ;
        *pEVar2 = *pEVar2 | 1 << ((char)this->intermediate->language & 0x1f);
      }
    }
  }
  else {
    iVar10 = (*local_280->_vptr_TType[0x1d])(local_280);
    if ((char)iVar10 == '\0') {
      iVar10 = (*local_280->_vptr_TType[0x25])(local_280);
      if ((char)iVar10 == '\0') {
LAB_00378490:
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
      pTVar15 = (local_280->field_13).referentType;
      memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.allocator
           = (TPoolAllocator *)0x0;
      memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.allocator
           = GetThreadPoolAllocator();
      memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
      super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (-1 < offset) {
        std::vector<int,_glslang::pool_allocator<int>_>::resize
                  (&memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>,
                   (long)(pTVar15->qualifier).semanticName - *(long *)&pTVar15->field_0x8 >> 5);
        getOffsets(this,local_280,
                   (TVector<int> *)&memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>);
      }
      if (0 < (int)((ulong)((long)(pTVar15->qualifier).semanticName - *(long *)&pTVar15->field_0x8)
                   >> 5)) {
        lVar24 = 0;
        lVar23 = 0;
        local_258 = offset;
        do {
          newBaseName_2._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          newBaseName_2._M_dataplus._M_p = (pointer)&newBaseName_2.field_2;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&newBaseName_2,name._M_dataplus._M_p,
                              name._M_dataplus._M_p + name._M_string_length);
          if (newBaseName_2._M_string_length != 0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::append(&newBaseName_2,".");
          }
          lVar17 = (**(code **)(**(long **)(*(long *)&pTVar15->field_0x8 + lVar24) + 0x30))();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          _M_append(&newBaseName_2,*(char **)(lVar17 + 8),*(size_type *)(lVar17 + 0x10));
          TType::TType((TType *)&newBaseName,local_280,(int)lVar23,false);
          if (-1 < local_258) {
            local_258 = memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                        super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[lVar23] + offset;
          }
          iVar11 = (*local_280->_vptr_TType[7])();
          iVar10 = topLevelArrayStride;
          if (((iVar11 == 0x10) &&
              (iVar11 = (*local_280->_vptr_TType[0xb])(),
              (*(uint *)(CONCAT44(extraout_var_00,iVar11) + 8) & 0x7f) == 6)) &&
             (local_140 != (TArraySizes *)0x0)) {
            iVar10 = getArrayStride(this,baseType,(TType *)&newBaseName);
          }
          if (topLevelArraySize == 0xffffffff && iVar10 == 0) {
            topLevelArraySize = bVar25 - 1 | 1;
          }
          iVar11 = local_258;
          TVar26 = baseStorage;
          bVar8 = active;
          uVar21 = topLevelArraySize;
          if (((byte)EVar3 & bVar25) == 0) {
LAB_00377f46:
            blowUpActiveAggregate
                      (this,(TType *)&newBaseName,&newBaseName_2,derefs,(const_iterator)deref_00,
                       iVar11,blockIndex,0,uVar21,iVar10,TVar26,bVar8);
          }
          else {
            if (local_140 == (TArraySizes *)0x0) {
LAB_00377efb:
              iVar11 = memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                       super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23];
              iVar13 = (*local_280->_vptr_TType[0xb])();
              iVar10 = 0;
              TVar26 = *(TStorageQualifier *)(CONCAT44(extraout_var_03,iVar13) + 8) & 0x7f;
              bVar8 = false;
              uVar21 = 1;
              goto LAB_00377f46;
            }
            if ((byte)newBaseName._M_dataplus._M_p - 0xf < 2) {
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        (&newBaseName_2,"[0]");
              cVar9 = (*(code *)newBaseName._M_dataplus.super_allocator_type.allocator[2].freeList)
                                (&newBaseName);
              if ((cVar9 == '\0') ||
                 (uVar21 = TSmallArrayVector::frontSize(&local_140->sizes), uVar21 != 0)) {
                uVar21 = TSmallArrayVector::getDimSize(&local_140->sizes,0);
              }
              else {
                uVar21 = 0;
              }
              this_01 = (TType *)&newBaseName_1;
              TType::TType(this_01,(TType *)&newBaseName,0,false);
              iVar11 = memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                       super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23];
              iVar13 = (*local_280->_vptr_TType[0xb])();
              TVar26 = *(TStorageQualifier *)(CONCAT44(extraout_var_01,iVar13) + 8);
            }
            else {
              if (local_140 == (TArraySizes *)0x0) goto LAB_00377efb;
              cVar9 = (*(code *)newBaseName._M_dataplus.super_allocator_type.allocator[2].freeList)
                                (&newBaseName);
              if ((cVar9 == '\0') ||
                 (uVar21 = TSmallArrayVector::frontSize(&local_140->sizes), uVar21 != 0)) {
                uVar21 = TSmallArrayVector::getDimSize(&local_140->sizes,0);
              }
              else {
                uVar21 = 0;
              }
              iVar11 = memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                       super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar23];
              iVar10 = (*local_280->_vptr_TType[0xb])();
              TVar26 = *(TStorageQualifier *)(CONCAT44(extraout_var_02,iVar10) + 8);
              this_01 = (TType *)&newBaseName;
              iVar10 = 0;
            }
            blowUpActiveAggregate
                      (this,this_01,&newBaseName_2,derefs,(const_iterator)deref_00,iVar11,blockIndex
                       ,0,uVar21,iVar10,TVar26 & 0x7f,false);
          }
          lVar23 = lVar23 + 1;
          lVar24 = lVar24 + 0x20;
        } while (lVar23 < (int)((ulong)((long)(pTVar15->qualifier).semanticName -
                                       *(long *)&pTVar15->field_0x8) >> 5));
      }
    }
    else {
      if (offset < 0) {
        iVar10 = 0;
      }
      else {
        iVar10 = getArrayStride(this,baseType,local_280);
      }
      uVar12 = (*local_280->_vptr_TType[0xf])(local_280);
      uVar21 = 1;
      if (1 < (int)uVar12) {
        uVar21 = uVar12;
      }
      if ((((EVar3 & EShReflectionStrictArraySuffix) != EShReflectionDefault) && (bVar25 != false))
         || ((uVar21 == topLevelArraySize && (topLevelArrayStride == 0)))) {
        uVar21 = 1;
      }
      if (topLevelArrayStride == 0) {
        topLevelArrayStride = iVar10;
      }
      uVar22 = 0;
      iVar11 = offset;
      do {
        newBaseName_1._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
        newBaseName_1._M_dataplus._M_p = (pointer)&newBaseName_1.field_2;
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                             *)&newBaseName_1,name._M_dataplus._M_p,
                            name._M_dataplus._M_p + name._M_string_length);
        iVar13 = (*local_280->_vptr_TType[7])();
        if (iVar13 != 0x10) {
          memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
          super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Tp_alloc_type.
          allocator = GetThreadPoolAllocator();
          memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
          super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (pointer)&memberOffsets.super_vector<int,_glslang::pool_allocator<int>_>.
                               super__Vector_base<int,_glslang::pool_allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     &memberOffsets,"[","");
          snprintf(text,0x10,"%d",uVar22);
          text_1._0_8_ = GetThreadPoolAllocator();
          text_1._8_8_ = local_f0;
          sVar19 = strlen(text);
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>
                    ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                     text_1,text,text + sVar19);
          pbVar20 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    _M_append((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)&memberOffsets,(char *)text_1._8_8_,local_f8);
          newBaseName_2._M_dataplus.super_allocator_type.allocator =
               (pbVar20->_M_dataplus).super_allocator_type.allocator;
          newBaseName_2._M_dataplus._M_p = (pointer)&newBaseName_2.field_2;
          pcVar4 = (pbVar20->_M_dataplus)._M_p;
          paVar1 = &pbVar20->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
               *)pcVar4 == paVar1) {
            newBaseName_2.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            newBaseName_2.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
          }
          else {
            newBaseName_2.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            newBaseName_2._M_dataplus._M_p = pcVar4;
          }
          newBaseName_2._M_string_length = pbVar20->_M_string_length;
          (pbVar20->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar20->_M_string_length = 0;
          (pbVar20->field_2)._M_local_buf[0] = '\0';
          pbVar20 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    append(&newBaseName_2,"]");
          newBaseName._M_dataplus.super_allocator_type.allocator =
               (pbVar20->_M_dataplus).super_allocator_type.allocator;
          newBaseName._M_dataplus._M_p = (pointer)&newBaseName.field_2;
          pcVar4 = (pbVar20->_M_dataplus)._M_p;
          paVar1 = &pbVar20->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
               *)pcVar4 == paVar1) {
            newBaseName.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            newBaseName.field_2._8_8_ = *(undefined8 *)((long)&pbVar20->field_2 + 8);
          }
          else {
            newBaseName.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
            newBaseName._M_dataplus._M_p = pcVar4;
          }
          newBaseName._M_string_length = pbVar20->_M_string_length;
          (pbVar20->_M_dataplus)._M_p = (pointer)paVar1;
          pbVar20->_M_string_length = 0;
          (pbVar20->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          _M_append(&newBaseName_1,newBaseName._M_dataplus._M_p,newBaseName._M_string_length);
        }
        TType::TType((TType *)&newBaseName,local_280,0,false);
        if (-1 < iVar11) {
          iVar11 = offset;
        }
        blowUpActiveAggregate
                  (this,(TType *)&newBaseName,&newBaseName_1,derefs,(const_iterator)deref_00,iVar11,
                   blockIndex,0,topLevelArraySize,topLevelArrayStride,baseStorage,active);
        uVar12 = (int)uVar22 + 1;
        uVar22 = (ulong)uVar12;
        offset = offset + iVar10;
      } while (uVar21 != uVar12);
    }
  }
  return;
}

Assistant:

void blowUpActiveAggregate(const TType& baseType, const TString& baseName, const TList<TIntermBinary*>& derefs,
                               TList<TIntermBinary*>::const_iterator deref, int offset, int blockIndex, int arraySize,
                               int topLevelArraySize, int topLevelArrayStride, TStorageQualifier baseStorage, bool active)
    {
        // when strictArraySuffix is enabled, we closely follow the rules from ARB_program_interface_query.
        // Broadly:
        // * arrays-of-structs always have a [x] suffix.
        // * with array-of-struct variables in the root of a buffer block, only ever return [0].
        // * otherwise, array suffixes are added whenever we iterate, even if that means expanding out an array.
        const bool strictArraySuffix = (reflection.options & EShReflectionStrictArraySuffix);

        // is this variable inside a buffer block. This flag is set back to false after we iterate inside the first array element.
        bool blockParent = (baseType.getBasicType() == EbtBlock && baseType.getQualifier().storage == EvqBuffer);

        // process the part of the dereference chain that was explicit in the shader
        TString name = baseName;
        const TType* terminalType = &baseType;
        for (; deref != derefs.end(); ++deref) {
            TIntermBinary* visitNode = *deref;
            terminalType = &visitNode->getType();
            int index;
            switch (visitNode->getOp()) {
            case EOpIndexIndirect: {
                int stride = getArrayStride(baseType, visitNode->getLeft()->getType());

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                // Visit all the indices of this array, and for each one add on the remaining dereferencing
                for (int i = 0; i < std::max(visitNode->getLeft()->getType().getOuterArraySize(), 1); ++i) {
                    TString newBaseName = name;
                    if (terminalType->getBasicType() == EbtBlock) {}
                    else if (strictArraySuffix && blockParent)
                        newBaseName.append(TString("[0]"));
                    else if (strictArraySuffix || baseType.getBasicType() != EbtBlock)
                        newBaseName.append(TString("[") + String(i) + "]");
                    TList<TIntermBinary*>::const_iterator nextDeref = deref;
                    ++nextDeref;
                    blowUpActiveAggregate(*terminalType, newBaseName, derefs, nextDeref, offset, blockIndex, arraySize,
                                          topLevelArraySize, topLevelArrayStride, baseStorage, active);

                    if (offset >= 0)
                        offset += stride;
                }

                // it was all completed in the recursive calls above
                return;
            }
            case EOpIndexDirect: {
                int stride = getArrayStride(baseType, visitNode->getLeft()->getType());

                index = visitNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
                if (terminalType->getBasicType() == EbtBlock) {}
                else if (strictArraySuffix && blockParent)
                    name.append(TString("[0]"));
                else if (strictArraySuffix || baseType.getBasicType() != EbtBlock) {
                    name.append(TString("[") + String(index) + "]");

                    if (offset >= 0)
                        offset += stride * index;
                }

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                // expand top-level arrays in blocks with [0] suffix
                if (topLevelArrayStride != 0 && visitNode->getLeft()->getType().isArray()) {
                    blockParent = false;
                }
                break;
            }
            case EOpIndexDirectStruct:
                index = visitNode->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();
                if (offset >= 0)
                    offset += intermediate.getOffset(visitNode->getLeft()->getType(), index);
                if (name.size() > 0)
                    name.append(".");
                name.append((*visitNode->getLeft()->getType().getStruct())[index].type->getFieldName());

                // expand non top-level arrays with [x] suffix
                if (visitNode->getLeft()->getType().getBasicType() != EbtBlock && terminalType->isArray())
                {
                    blockParent = false;
                }
                break;
            default:
                break;
            }
        }

        // if the terminalType is still too coarse a granularity, this is still an aggregate to expand, expand it...
        if (! isReflectionGranularity(*terminalType)) {
            // the base offset of this node, that children are relative to
            int baseOffset = offset;

            if (terminalType->isArray()) {
                // Visit all the indices of this array, and for each one,
                // fully explode the remaining aggregate to dereference

                int stride = 0;
                if (offset >= 0)
                    stride = getArrayStride(baseType, *terminalType);

                int arrayIterateSize = std::max(terminalType->getOuterArraySize(), 1);

                // for top-level arrays in blocks, only expand [0] to avoid explosion of items
                if ((strictArraySuffix && blockParent) ||
                    ((topLevelArraySize == arrayIterateSize) && (topLevelArrayStride == 0))) {
                    arrayIterateSize = 1;
                }

                if (topLevelArrayStride == 0)
                    topLevelArrayStride = stride;

                for (int i = 0; i < arrayIterateSize; ++i) {
                    TString newBaseName = name;
                    if (terminalType->getBasicType() != EbtBlock)
                        newBaseName.append(TString("[") + String(i) + "]");
                    TType derefType(*terminalType, 0);
                    if (offset >= 0)
                        offset = baseOffset + stride * i;

                    blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), offset, blockIndex, 0,
                                          topLevelArraySize, topLevelArrayStride, baseStorage, active);
                }
            } else {
                // Visit all members of this aggregate, and for each one,
                // fully explode the remaining aggregate to dereference
                const TTypeList& typeList = *terminalType->getStruct();

                TVector<int> memberOffsets;

                if (baseOffset >= 0) {
                    memberOffsets.resize(typeList.size());
                    getOffsets(*terminalType, memberOffsets);
                }

                for (int i = 0; i < (int)typeList.size(); ++i) {
                    TString newBaseName = name;
                    if (newBaseName.size() > 0)
                        newBaseName.append(".");
                    newBaseName.append(typeList[i].type->getFieldName());
                    TType derefType(*terminalType, i);
                    if (offset >= 0)
                        offset = baseOffset + memberOffsets[i];

                    int arrayStride = topLevelArrayStride;
                    if (terminalType->getBasicType() == EbtBlock && terminalType->getQualifier().storage == EvqBuffer &&
                        derefType.isArray()) {
                        arrayStride = getArrayStride(baseType, derefType);
                    }

                    if (topLevelArraySize == -1 && arrayStride == 0 && blockParent)
                        topLevelArraySize = 1;

                    if (strictArraySuffix && blockParent) {
                        // if this member is an array, store the top-level array stride but start the explosion from
                        // the inner struct type.
                        if (derefType.isArray() && derefType.isStruct()) {
                            newBaseName.append("[0]");
                            auto dimSize = derefType.isUnsizedArray() ? 0 : derefType.getArraySizes()->getDimSize(0);
                            blowUpActiveAggregate(TType(derefType, 0), newBaseName, derefs, derefs.end(), memberOffsets[i],
                                blockIndex, 0, dimSize, arrayStride, terminalType->getQualifier().storage, false);
                        }
                        else if (derefType.isArray()) {
                            auto dimSize = derefType.isUnsizedArray() ? 0 : derefType.getArraySizes()->getDimSize(0);
                            blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), memberOffsets[i], blockIndex,
                                0, dimSize, 0, terminalType->getQualifier().storage, false);
                        }
                        else {
                            blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), memberOffsets[i], blockIndex,
                                0, 1, 0, terminalType->getQualifier().storage, false);
                        }
                    } else {
                        blowUpActiveAggregate(derefType, newBaseName, derefs, derefs.end(), offset, blockIndex, 0,
                                              topLevelArraySize, arrayStride, baseStorage, active);
                    }
                }
            }

            // it was all completed in the recursive calls above
            return;
        }

        if ((reflection.options & EShReflectionBasicArraySuffix) && terminalType->isArray()) {
            name.append(TString("[0]"));
        }

        // Finally, add a full string to the reflection database, and update the array size if necessary.
        // If the dereferenced entity to record is an array, compute the size and update the maximum size.

        // there might not be a final array dereference, it could have been copied as an array object
        if (arraySize == 0)
            arraySize = mapToGlArraySize(*terminalType);

        TReflection::TMapIndexToReflection& variables = reflection.GetVariableMapForStorage(baseStorage);

        TReflection::TNameToIndex::const_iterator it = reflection.nameToIndex.find(name.c_str());
        if (it == reflection.nameToIndex.end()) {
            int uniformIndex = (int)variables.size();
            reflection.nameToIndex[name.c_str()] = uniformIndex;
            variables.push_back(TObjectReflection(name.c_str(), *terminalType, offset, mapToGlType(*terminalType),
                                                  arraySize, blockIndex));
            if (terminalType->isArray()) {
                variables.back().arrayStride = getArrayStride(baseType, *terminalType);
                if (topLevelArrayStride == 0)
                    topLevelArrayStride = variables.back().arrayStride;
            }

            if ((reflection.options & EShReflectionSeparateBuffers) && terminalType->isAtomic())
                reflection.atomicCounterUniformIndices.push_back(uniformIndex);

            variables.back().topLevelArraySize = topLevelArraySize;
            variables.back().topLevelArrayStride = topLevelArrayStride;
            
            if ((reflection.options & EShReflectionAllBlockVariables) && active) {
                EShLanguageMask& stages = variables.back().stages;
                stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
            }
        } else {
            if (arraySize > 1) {
                int& reflectedArraySize = variables[it->second].size;
                reflectedArraySize = std::max(arraySize, reflectedArraySize);
            }

            if ((reflection.options & EShReflectionAllBlockVariables) && active) {
              EShLanguageMask& stages = variables[it->second].stages;
              stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
            }
        }
    }